

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

RepeatedPtrField<google::protobuf::MessageLite> *
google::protobuf::Arena::
CreateArenaCompatible<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
          (Arena *arena)

{
  RepeatedPtrField<google::protobuf::MessageLite> *pRVar1;
  
  if (arena == (Arena *)0x0) {
    pRVar1 = (RepeatedPtrField<google::protobuf::MessageLite> *)operator_new(0x18);
    (pRVar1->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ = (void *)0x0;
    (pRVar1->super_RepeatedPtrFieldBase).current_size_ = 0;
    (pRVar1->super_RepeatedPtrFieldBase).capacity_proxy_ = 0;
    (pRVar1->super_RepeatedPtrFieldBase).arena_ = (Arena *)0x0;
    return pRVar1;
  }
  pRVar1 = (RepeatedPtrField<google::protobuf::MessageLite> *)
           AllocateInternal<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>,true>
                     (arena);
  (pRVar1->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ = (void *)0x0;
  (pRVar1->super_RepeatedPtrFieldBase).current_size_ = 0;
  (pRVar1->super_RepeatedPtrFieldBase).capacity_proxy_ = 0;
  (pRVar1->super_RepeatedPtrFieldBase).arena_ = arena;
  return pRVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* PROTOBUF_NONNULL
  CreateArenaCompatible(Arena* PROTOBUF_NULLABLE arena) {
    static_assert(is_arena_constructable<T>::value,
                  "Can only construct types that are ArenaConstructable");
    if (ABSL_PREDICT_FALSE(arena == nullptr)) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }